

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O2

JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> * __thiscall
(anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
          (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,void *this,
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *bt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  JBTIndex JVar3;
  char *local_38;
  size_type local_30;
  char local_28;
  undefined7 uStack_27;
  undefined8 uStack_20;
  
  std::__cxx11::string::string((string *)&local_38,(string *)bt);
  JVar3 = anon_unknown.dwarf_18f22ea::BacktraceData::Add
                    ((BacktraceData *)((long)this + 0x68),&bt->Backtrace);
  sVar2 = local_30;
  paVar1 = &(__return_storage_ptr__->Value).field_2;
  (__return_storage_ptr__->Value)._M_dataplus._M_p = (pointer)paVar1;
  if (local_38 == &local_28) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_27,local_28);
    *(undefined8 *)((long)&(__return_storage_ptr__->Value).field_2 + 8) = uStack_20;
  }
  else {
    (__return_storage_ptr__->Value)._M_dataplus._M_p = local_38;
    (__return_storage_ptr__->Value).field_2._M_allocated_capacity = CONCAT71(uStack_27,local_28);
  }
  local_30 = 0;
  (__return_storage_ptr__->Value)._M_string_length = sVar2;
  local_28 = '\0';
  (__return_storage_ptr__->Backtrace).Index = JVar3.Index;
  local_38 = &local_28;
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

JBT<T> ToJBT(BT<T> const& bt)
  {
    return JBT<T>(bt.Value, this->Backtraces.Add(bt.Backtrace));
  }